

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t RelativeDate(time_t Start,time_t zone,int dstmode,time_t DayOrdinal,time_t DayNumber)

{
  long Start_00;
  tm *ptVar1;
  time_t tVar2;
  long lVar3;
  time_t t;
  
  Start_00 = Start - zone;
  ptVar1 = gmtime((time_t *)&stack0xffffffffffffffd8);
  lVar3 = DayNumber - ptVar1->tm_wday;
  tVar2 = (DayOrdinal - (ulong)(0 < DayOrdinal)) * 0x93a80 +
          (lVar3 + ((lVar3 + 7) / 7) * -7 + 7) * 0x15180;
  if (dstmode == 2) {
    tVar2 = DSTcorrect(Start_00,0x115ff6);
  }
  return tVar2;
}

Assistant:

static time_t
RelativeDate(time_t Start, time_t zone, int dstmode,
    time_t DayOrdinal, time_t DayNumber)
{
	struct tm	*tm;
	time_t	t, now;

	t = Start - zone;
	tm = gmtime(&t);
	now = Start;
	now += DAY * ((DayNumber - tm->tm_wday + 7) % 7);
	now += 7 * DAY * (DayOrdinal <= 0 ? DayOrdinal : DayOrdinal - 1);
	if (dstmode == DSTmaybe)
		return DSTcorrect(Start, now);
	return now - Start;
}